

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O0

void __thiscall
CTilesetMapper::Proceed(CTilesetMapper *this,CLayerTiles *pLayer,int ConfigID,RECTi Area)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  CRuleSet *pCVar9;
  CTile *pCVar10;
  CRule *pCVar11;
  CRuleCondition *pCVar12;
  undefined8 in_RCX;
  byte bVar13;
  int in_EDX;
  CLayerTiles *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  float fVar14;
  int CheckIndex;
  CRuleCondition *pCondition;
  int j;
  bool RespectRules;
  int i;
  CTile *pTile;
  int x;
  int y;
  int MaxIndex;
  int BaseTile;
  CRuleSet *pConf;
  int local_5c;
  int local_54;
  int local_48;
  int local_44;
  RECTi local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((((in_RSI->super_CLayer).m_Readonly & 1U) == 0) && (-1 < in_EDX)) &&
     (local_18._0_8_ = in_RCX, local_18._8_8_ = in_R8,
     iVar5 = array<CTilesetMapper::CRuleSet,_allocator_default<CTilesetMapper::CRuleSet>_>::size
                       ((array<CTilesetMapper::CRuleSet,_allocator_default<CTilesetMapper::CRuleSet>_>
                         *)(in_RDI + 0x18)), in_EDX < iVar5)) {
    pCVar9 = array<CTilesetMapper::CRuleSet,_allocator_default<CTilesetMapper::CRuleSet>_>::
             operator[]((array<CTilesetMapper::CRuleSet,_allocator_default<CTilesetMapper::CRuleSet>_>
                         *)(in_RDI + 0x18),in_EDX);
    iVar5 = array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::size
                      (&pCVar9->m_aRules);
    if (iVar5 != 0) {
      CLayerTiles::Clamp(in_RSI,&local_18);
      iVar5 = pCVar9->m_BaseTile;
      iVar1 = in_RSI->m_Width;
      iVar2 = in_RSI->m_Height;
      local_44 = local_18.y;
      while( true ) {
        if (local_18.y + local_18.h <= local_44) break;
        local_48 = local_18.x;
        while( true ) {
          if (local_18.x + local_18.w <= local_48) break;
          pCVar10 = in_RSI->m_pTiles + (local_44 * in_RSI->m_Width + local_48);
          if (pCVar10->m_Index != '\0') {
            pCVar10->m_Index = (uchar)iVar5;
            for (local_54 = 0;
                iVar6 = array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::
                        size(&pCVar9->m_aRules), local_54 < iVar6; local_54 = local_54 + 1) {
              bVar3 = true;
              local_5c = 0;
              while( true ) {
                pCVar11 = array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::
                          operator[](&pCVar9->m_aRules,local_54);
                iVar6 = array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
                        ::size(&pCVar11->m_aConditions);
                bVar4 = false;
                if (local_5c < iVar6) {
                  bVar4 = bVar3;
                }
                if (!bVar4) break;
                pCVar11 = array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::
                          operator[](&pCVar9->m_aRules,local_54);
                pCVar12 = array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
                          ::operator[](&pCVar11->m_aConditions,local_5c);
                iVar7 = clamp<int>(local_44 + pCVar12->m_Y,0,in_RSI->m_Height + -1);
                iVar6 = in_RSI->m_Width;
                iVar8 = clamp<int>(local_48 + pCVar12->m_X,0,in_RSI->m_Width + -1);
                iVar8 = iVar7 * iVar6 + iVar8;
                if ((iVar8 < 0) || (iVar1 * iVar2 <= iVar8)) {
                  bVar3 = false;
                }
                else if ((pCVar12->m_Value == -2) || (pCVar12->m_Value == -1)) {
                  if ((in_RSI->m_pTiles[iVar8].m_Index != '\0') && (pCVar12->m_Value == -2)) {
                    bVar3 = false;
                  }
                  if ((in_RSI->m_pTiles[iVar8].m_Index == '\0') && (pCVar12->m_Value == -1)) {
                    bVar3 = false;
                  }
                }
                else if ((uint)in_RSI->m_pTiles[iVar8].m_Index != pCVar12->m_Value) {
                  bVar3 = false;
                }
                local_5c = local_5c + 1;
              }
              if (bVar3) {
                pCVar11 = array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::
                          operator[](&pCVar9->m_aRules,local_54);
                if (1 < pCVar11->m_Random) {
                  fVar14 = random_float();
                  pCVar11 = array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>
                            ::operator[](&pCVar9->m_aRules,local_54);
                  if ((int)(fVar14 * (float)pCVar11->m_Random) != 1) goto LAB_001e2d98;
                }
                pCVar11 = array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::
                          operator[](&pCVar9->m_aRules,local_54);
                pCVar10->m_Index = (uchar)pCVar11->m_Index;
                pCVar10->m_Flags = '\0';
                pCVar11 = array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::
                          operator[](&pCVar9->m_aRules,local_54);
                if (pCVar11->m_Rotation == 0x5a) {
                  pCVar10->m_Flags = pCVar10->m_Flags ^ 8;
                }
                else {
                  pCVar11 = array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>
                            ::operator[](&pCVar9->m_aRules,local_54);
                  if (pCVar11->m_Rotation == 0xb4) {
                    pCVar10->m_Flags = pCVar10->m_Flags ^ 3;
                  }
                  else {
                    pCVar11 = array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>
                              ::operator[](&pCVar9->m_aRules,local_54);
                    if (pCVar11->m_Rotation == 0x10e) {
                      pCVar10->m_Flags = pCVar10->m_Flags ^ 0xb;
                    }
                  }
                }
                pCVar11 = array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::
                          operator[](&pCVar9->m_aRules,local_54);
                if (pCVar11->m_HFlip != 0) {
                  bVar13 = 1;
                  if ((pCVar10->m_Flags & 8) != 0) {
                    bVar13 = 2;
                  }
                  pCVar10->m_Flags = pCVar10->m_Flags ^ bVar13;
                }
                pCVar11 = array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::
                          operator[](&pCVar9->m_aRules,local_54);
                if (pCVar11->m_VFlip != 0) {
                  bVar13 = 2;
                  if ((pCVar10->m_Flags & 8) != 0) {
                    bVar13 = 1;
                  }
                  pCVar10->m_Flags = pCVar10->m_Flags ^ bVar13;
                }
              }
LAB_001e2d98:
            }
          }
          local_48 = local_48 + 1;
        }
        local_44 = local_44 + 1;
      }
      *(undefined1 *)(*(long *)(in_RDI + 8) + 0x1248) = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTilesetMapper::Proceed(CLayerTiles *pLayer, int ConfigID, RECTi Area)
{
	if(pLayer->m_Readonly || ConfigID < 0 || ConfigID >= m_aRuleSets.size())
		return;

	CRuleSet *pConf = &m_aRuleSets[ConfigID];

	if(!pConf->m_aRules.size())
		return;

	pLayer->Clamp(&Area);
	
	int BaseTile = pConf->m_BaseTile;

	// auto map !
	int MaxIndex = pLayer->m_Width*pLayer->m_Height;
	for(int y = Area.y; y < Area.y + Area.h; y++)
		for(int x = Area.x; x < Area.x + Area.w; x++)
		{
			CTile *pTile = &(pLayer->m_pTiles[y*pLayer->m_Width+x]);
			if(pTile->m_Index == 0)
				continue;

			pTile->m_Index = BaseTile;

			for(int i = 0; i < pConf->m_aRules.size(); ++i)
			{
				bool RespectRules = true;
				for(int j = 0; j < pConf->m_aRules[i].m_aConditions.size() && RespectRules; ++j)
				{
					CRuleCondition *pCondition = &pConf->m_aRules[i].m_aConditions[j];
					int CheckIndex = clamp((y+pCondition->m_Y), 0, pLayer->m_Height-1)*pLayer->m_Width+clamp((x+pCondition->m_X), 0, pLayer->m_Width-1);

					if(CheckIndex < 0 || CheckIndex >= MaxIndex)
						RespectRules = false;
					else
					{
 						if(pCondition->m_Value == CRuleCondition::EMPTY || pCondition->m_Value == CRuleCondition::FULL)
						{
							if(pLayer->m_pTiles[CheckIndex].m_Index > 0 && pCondition->m_Value == CRuleCondition::EMPTY)
								RespectRules = false;

							if(pLayer->m_pTiles[CheckIndex].m_Index == 0 && pCondition->m_Value == CRuleCondition::FULL)
								RespectRules = false;
						}
						else
						{
							if(pLayer->m_pTiles[CheckIndex].m_Index != pCondition->m_Value)
								RespectRules = false;
						}
					}
				}

				if(RespectRules && (pConf->m_aRules[i].m_Random <= 1 || (int)(random_float() * pConf->m_aRules[i].m_Random) == 1))
				{
					pTile->m_Index = pConf->m_aRules[i].m_Index;
					pTile->m_Flags = 0;

					// rotate
					if(pConf->m_aRules[i].m_Rotation == 90)
						pTile->m_Flags ^= TILEFLAG_ROTATE;
					else if(pConf->m_aRules[i].m_Rotation == 180)
						pTile->m_Flags ^= (TILEFLAG_HFLIP|TILEFLAG_VFLIP);
					else if(pConf->m_aRules[i].m_Rotation == 270)
						pTile->m_Flags ^= (TILEFLAG_HFLIP|TILEFLAG_VFLIP|TILEFLAG_ROTATE);

					// flip
					if(pConf->m_aRules[i].m_HFlip)
						pTile->m_Flags ^= pTile->m_Flags&TILEFLAG_ROTATE ? TILEFLAG_HFLIP : TILEFLAG_VFLIP;
					if(pConf->m_aRules[i].m_VFlip)
						pTile->m_Flags ^= pTile->m_Flags&TILEFLAG_ROTATE ? TILEFLAG_VFLIP : TILEFLAG_HFLIP;
				}
			}
		}

	m_pEditor->m_Map.m_Modified = true;
}